

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O3

bool splitFilePath(string *path,string *directory,string *basename,string *field)

{
  size_type sVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  ulong *puVar5;
  bool bVar6;
  string jsonPath;
  string file;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  string *local_f8;
  ulong local_f0;
  string *local_e8;
  char *local_e0;
  undefined8 local_d8;
  char local_d0 [16];
  stat local_c0;
  
  iVar2 = stat((path->_M_dataplus)._M_p,&local_c0);
  if (iVar2 == 0) {
    sVar1 = path->_M_string_length;
    local_f8 = basename;
    local_e8 = field;
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)path);
    iVar2 = std::__cxx11::string::compare((char *)&local_c0);
    if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
      operator_delete((void *)local_c0.st_dev);
    }
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::find_last_of((char *)path,0x12c085,0xffffffffffffffff);
      if (iVar2 == -1) {
        std::__cxx11::string::_M_replace
                  ((ulong)directory,0,(char *)directory->_M_string_length,0x12ca6c);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_c0,(ulong)path);
        std::__cxx11::string::operator=((string *)directory,(string *)&local_c0);
        if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
          operator_delete((void *)local_c0.st_dev);
        }
      }
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)path);
      std::__cxx11::string::operator=((string *)local_f8,(string *)&local_c0);
      if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
        operator_delete((void *)local_c0.st_dev);
      }
      return true;
    }
    iVar2 = (int)sVar1;
    if (6 < iVar2) {
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)path);
      iVar3 = std::__cxx11::string::compare((char *)&local_c0);
      if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
        operator_delete((void *)local_c0.st_dev);
      }
      if ((iVar3 == 0) &&
         (iVar3 = std::__cxx11::string::find_last_of((char *)path,0x12c08d,0xffffffffffffffff),
         iVar3 <= iVar2 + -6 && iVar3 != -1)) {
        local_e0 = local_d0;
        local_d8 = 0;
        local_d0[0] = '\0';
        do {
          std::__cxx11::string::substr((ulong)local_118,(ulong)path);
          plVar4 = (long *)std::__cxx11::string::append((char *)local_118);
          puVar5 = (ulong *)(plVar4 + 2);
          if ((__nlink_t *)*plVar4 == puVar5) {
            local_c0.st_nlink = *puVar5;
            local_c0._24_8_ = plVar4[3];
            local_c0.st_dev = (__dev_t)&local_c0.st_nlink;
          }
          else {
            local_c0.st_nlink = *puVar5;
            local_c0.st_dev = (__dev_t)*plVar4;
          }
          local_c0.st_ino = plVar4[1];
          *plVar4 = (long)puVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_c0);
          if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
            operator_delete((void *)local_c0.st_dev);
          }
          if (local_118[0] != local_108) {
            operator_delete(local_118[0]);
          }
          iVar2 = stat(local_e0,&local_c0);
        } while ((iVar2 != 0) &&
                (iVar3 = std::__cxx11::string::find_last_of
                                   ((char *)path,0x12c08d,(long)(iVar3 + -1)), iVar3 != -1));
        bVar6 = iVar3 != -1;
        if (bVar6) {
          local_f0 = std::__cxx11::string::find_last_of((char *)path,0x12c085,0xffffffffffffffff);
          local_c0.st_dev = (__dev_t)&local_c0.st_nlink;
          local_c0.st_ino = 0;
          local_c0.st_nlink = local_c0.st_nlink & 0xffffffffffffff00;
          if ((local_f0 & 0xffffffff) == 0xffffffff) {
            std::__cxx11::string::operator=((string *)directory,".");
            std::__cxx11::string::_M_assign((string *)&local_c0);
          }
          else {
            std::__cxx11::string::substr((ulong)local_118,(ulong)path);
            std::__cxx11::string::operator=((string *)directory,(string *)local_118);
            if (local_118[0] != local_108) {
              operator_delete(local_118[0]);
            }
            std::__cxx11::string::substr((ulong)local_118,(ulong)path);
            std::__cxx11::string::operator=((string *)&local_c0,(string *)local_118);
            if (local_118[0] != local_108) {
              operator_delete(local_118[0]);
            }
          }
          std::__cxx11::string::substr((ulong)local_118,(ulong)path);
          std::__cxx11::string::operator=((string *)local_f8,(string *)local_118);
          if (local_118[0] != local_108) {
            operator_delete(local_118[0]);
          }
          std::__cxx11::string::substr((ulong)local_118,(ulong)path);
          std::__cxx11::string::operator=((string *)local_e8,(string *)local_118);
          if (local_118[0] != local_108) {
            operator_delete(local_118[0]);
          }
          if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
            operator_delete((void *)local_c0.st_dev);
          }
        }
        if (local_e0 == local_d0) {
          return bVar6;
        }
        operator_delete(local_e0);
        return bVar6;
      }
    }
  }
  return false;
}

Assistant:

bool splitFilePath(const std::string& path, std::string& directory, std::string& basename, std::string& field)
{
	if (!fileExists(path))
	{
		return false;
	}

	int size = path.length();

	if (path.substr(size - 5, 5) == ".json")
	{
		int lastSlash = path.find_last_of("/\\");

		if (lastSlash == std::string::npos)
			directory = ".";
		else
			directory = path.substr(0, lastSlash);

		basename = path.substr(lastSlash + 1, size - lastSlash - 6);

		return true;
	}


	if (size < 7)
	{
		return false;
	}

	if (path.substr(size - 4, 4) != ".dat")
	{
		return false;
	}

	int last_ = path.find_last_of("_");
	if (last_ == std::string::npos || last_ > size - 6)
	{
		return false;
	}

	std::string jsonPath;
	do
	{
		jsonPath = path.substr(0, last_) + ".json";
	}
	while (!fileExists(jsonPath) && (last_ = path.find_last_of("_", last_ - 1)) != std::string::npos);

	if (last_ == std::string::npos)
	{
		return false;
	}

	int lastSlash = path.find_last_of("/\\");
	std::string file;

	if (lastSlash == std::string::npos)
	{
		directory = ".";
		file = path;
	}
	else
	{
		directory = path.substr(0, lastSlash);
		file = path.substr(lastSlash + 1);
	}

	basename = path.substr(lastSlash + 1, (last_ - lastSlash) - 1);
	field = path.substr(last_ + 1, size - last_ - 5);

	return true;
}